

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseSpecialPosition
          (CollationRuleParser *this,int32_t i,UnicodeString *str,UErrorCode *errorCode)

{
  UBool UVar1;
  char16_t cVar2;
  UnicodeString *pUVar3;
  ConstChar16Ptr local_160;
  UnicodeString local_158;
  ConstChar16Ptr local_118;
  UnicodeString local_110;
  undefined4 local_cc;
  UnicodeString local_c8;
  int local_88;
  int32_t pos;
  int32_t local_74;
  undefined1 local_70 [4];
  int32_t j;
  UnicodeString raw;
  UErrorCode *errorCode_local;
  UnicodeString *str_local;
  int32_t i_local;
  CollationRuleParser *this_local;
  
  raw.fUnion._48_8_ = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return 0;
  }
  UnicodeString::UnicodeString((UnicodeString *)local_70);
  local_74 = readWords(this,i + 1,(UnicodeString *)local_70);
  if (((i < local_74) && (cVar2 = UnicodeString::charAt(this->rules,local_74), cVar2 == L']')) &&
     (UVar1 = UnicodeString::isEmpty((UnicodeString *)local_70), UVar1 == '\0')) {
    local_74 = local_74 + 1;
    for (local_88 = 0; local_88 < 0xe; local_88 = local_88 + 1) {
      UnicodeString::UnicodeString
                (&local_c8,*(char **)((anonymous_namespace)::positions + (long)local_88 * 8),-1,
                 kInvariant);
      UVar1 = UnicodeString::operator==((UnicodeString *)local_70,&local_c8);
      UnicodeString::~UnicodeString(&local_c8);
      if (UVar1 != '\0') {
        pUVar3 = UnicodeString::setTo(str,L'\xfffe');
        UnicodeString::append(pUVar3,(short)local_88 + L'⠀');
        this_local._4_4_ = local_74;
        goto LAB_002a402f;
      }
    }
    ConstChar16Ptr::ConstChar16Ptr(&local_118,L"top");
    UnicodeString::UnicodeString(&local_110,'\x01',&local_118,-1);
    UVar1 = UnicodeString::operator==((UnicodeString *)local_70,&local_110);
    UnicodeString::~UnicodeString(&local_110);
    ConstChar16Ptr::~ConstChar16Ptr(&local_118);
    if (UVar1 != '\0') {
      pUVar3 = UnicodeString::setTo(str,L'\xfffe');
      UnicodeString::append(pUVar3,L'⠉');
      this_local._4_4_ = local_74;
      goto LAB_002a402f;
    }
    ConstChar16Ptr::ConstChar16Ptr(&local_160,L"variable top");
    UnicodeString::UnicodeString(&local_158,'\x01',&local_160,-1);
    UVar1 = UnicodeString::operator==((UnicodeString *)local_70,&local_158);
    UnicodeString::~UnicodeString(&local_158);
    ConstChar16Ptr::~ConstChar16Ptr(&local_160);
    if (UVar1 != '\0') {
      pUVar3 = UnicodeString::setTo(str,L'\xfffe');
      UnicodeString::append(pUVar3,L'⠇');
      this_local._4_4_ = local_74;
      goto LAB_002a402f;
    }
  }
  setParseError(this,"not a valid special reset position",(UErrorCode *)raw.fUnion._48_8_);
  this_local._4_4_ = i;
LAB_002a402f:
  local_cc = 1;
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return this_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::parseSpecialPosition(int32_t i, UnicodeString &str, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UnicodeString raw;
    int32_t j = readWords(i + 1, raw);
    if(j > i && rules->charAt(j) == 0x5d && !raw.isEmpty()) {  // words end with ]
        ++j;
        for(int32_t pos = 0; pos < UPRV_LENGTHOF(positions); ++pos) {
            if(raw == UnicodeString(positions[pos], -1, US_INV)) {
                str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + pos));
                return j;
            }
        }
        if(raw == UNICODE_STRING_SIMPLE("top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_REGULAR));
            return j;
        }
        if(raw == UNICODE_STRING_SIMPLE("variable top")) {
            str.setTo((UChar)POS_LEAD).append((UChar)(POS_BASE + LAST_VARIABLE));
            return j;
        }
    }
    setParseError("not a valid special reset position", errorCode);
    return i;
}